

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O0

void __thiscall lsim::ModelWire::move(ModelWire *this,Point *delta)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_> *junction;
  iterator __end1;
  iterator __begin1;
  junction_container_t *__range1;
  Point *delta_local;
  ModelWire *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
           ::begin(&this->m_junctions);
  junction = (unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_> *)
             std::
             vector<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
             ::end(&this->m_junctions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>_>
                                *)&junction);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>_>
              ::operator*(&__end1);
    this_01 = std::
              unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>::
              operator->(this_00);
    ModelWireJunction::move(this_01,delta);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ModelWire::move(const Point& delta) {
	for (auto& junction : m_junctions) {
		junction->move(delta);
	}
}